

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_global.c
# Opt level: O1

void dealloc_globals_chain(Dwarf_Debug dbg,Dwarf_Chain head_chain)

{
  int iVar1;
  Dwarf_Ptr space;
  Dwarf_Ptr space_00;
  Dwarf_Chain pDVar2;
  Dwarf_Ptr pvVar3;
  Dwarf_Chain curr_chain;
  
  if (head_chain != (Dwarf_Chain)0x0) {
    pvVar3 = (Dwarf_Ptr)0x0;
    do {
      space = head_chain->ch_item;
      iVar1 = head_chain->ch_itemtype;
      space_00 = *(Dwarf_Ptr *)((long)space + 0x10);
      if (space_00 != pvVar3 && space_00 != (Dwarf_Ptr)0x0) {
        dwarf_dealloc(dbg,space_00,(ulong)*(uint *)((long)space_00 + 4));
        pvVar3 = space_00;
      }
      dwarf_dealloc(dbg,space,(long)iVar1);
      head_chain->ch_item = (void *)0x0;
      pDVar2 = head_chain->ch_next;
      dwarf_dealloc(dbg,head_chain,0x1f);
      head_chain = pDVar2;
    } while (pDVar2 != (Dwarf_Chain)0x0);
  }
  return;
}

Assistant:

static void
dealloc_globals_chain(Dwarf_Debug dbg,
    Dwarf_Chain head_chain)
{
    Dwarf_Chain curr_chain = 0;
    int chaintype = DW_DLA_CHAIN;
    Dwarf_Global_Context lastcontext = 0;
    Dwarf_Global_Context curcontext = 0;

    curr_chain = head_chain;
    for (; curr_chain; ) {
        Dwarf_Global item = 0;
        int itemtype = 0;
        Dwarf_Chain prev = 0;

        item = (Dwarf_Global)curr_chain->ch_item;
        itemtype = curr_chain->ch_itemtype;
        curcontext = item->gl_context;
        if (curcontext && curcontext != lastcontext) {
            /* First time we see a context, dealloc it. */
            lastcontext = curcontext;
            dwarf_dealloc(dbg,curcontext,curcontext->pu_alloc_type);
        }
        prev = curr_chain;
        dwarf_dealloc(dbg, item,itemtype);
        prev->ch_item = 0;
        curr_chain = curr_chain->ch_next;
        dwarf_dealloc(dbg, prev, chaintype);
    }
}